

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_realip_module.c
# Opt level: O0

ngx_int_t ngx_stream_realip_init(ngx_conf_t *cf)

{
  undefined8 *puVar1;
  ngx_stream_core_main_conf_t *cmcf;
  ngx_stream_handler_pt *h;
  ngx_conf_t *cf_local;
  
  puVar1 = (undefined8 *)
           ngx_array_push((ngx_array_t *)
                          (*(long *)(*cf->ctx + ngx_stream_core_module.ctx_index * 8) + 0xd8));
  if (puVar1 == (undefined8 *)0x0) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    *puVar1 = ngx_stream_realip_handler;
    cf_local = (ngx_conf_t *)0x0;
  }
  return (ngx_int_t)cf_local;
}

Assistant:

static ngx_int_t
ngx_stream_realip_init(ngx_conf_t *cf)
{
    ngx_stream_handler_pt        *h;
    ngx_stream_core_main_conf_t  *cmcf;

    cmcf = ngx_stream_conf_get_module_main_conf(cf, ngx_stream_core_module);

    h = ngx_array_push(&cmcf->phases[NGX_STREAM_POST_ACCEPT_PHASE].handlers);
    if (h == NULL) {
        return NGX_ERROR;
    }

    *h = ngx_stream_realip_handler;

    return NGX_OK;
}